

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryVkImpl.cpp
# Opt level: O0

bool Diligent::anon_unknown_60::GetBinaryOcclusionQueryData
               (VulkanLogicalDevice *LogicalDevice,VkQueryPool vkQueryPool,uint32_t QueryIdx,
               void *pData,Uint32 DataSize)

{
  bool bVar1;
  Char *Message;
  reference pvVar2;
  array<unsigned_long,_2UL> *Results_00;
  undefined1 local_70 [8];
  string msg;
  QueryDataBinaryOcclusion *QueryData;
  undefined1 local_40 [7];
  bool DataAvailable;
  array<unsigned_long,_2UL> Results;
  Uint32 DataSize_local;
  void *pData_local;
  uint32_t QueryIdx_local;
  VkQueryPool vkQueryPool_local;
  VulkanLogicalDevice *LogicalDevice_local;
  
  Results._M_elems[1]._4_4_ = DataSize;
  memset(local_40,0,0x10);
  Results_00 = (array<unsigned_long,_2UL> *)local_40;
  bVar1 = (anonymous_namespace)::GetQueryResults<2ul>(LogicalDevice,vkQueryPool,QueryIdx,Results_00)
  ;
  if ((bVar1) && (pData != (void *)0x0)) {
    msg.field_2._8_8_ = pData;
    if (Results._M_elems[1]._4_4_ != 8) {
      FormatString<char[26],char[30]>
                ((string *)local_70,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"DataSize == sizeof(QueryData)",(char (*) [30])Results_00);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"GetBinaryOcclusionQueryData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
                 ,0xd6);
      std::__cxx11::string::~string((string *)local_70);
    }
    pvVar2 = std::array<unsigned_long,_2UL>::operator[]((array<unsigned_long,_2UL> *)local_40,0);
    *(bool *)(msg.field_2._8_8_ + 4) = *pvVar2 != 0;
  }
  return bVar1;
}

Assistant:

inline bool GetBinaryOcclusionQueryData(const VulkanUtilities::VulkanLogicalDevice& LogicalDevice,
                                        VkQueryPool                                 vkQueryPool,
                                        uint32_t                                    QueryIdx,
                                        void*                                       pData,
                                        Uint32                                      DataSize)
{
    std::array<uint64_t, 2> Results{};

    const auto DataAvailable = GetQueryResults(LogicalDevice, vkQueryPool, QueryIdx, Results);
    if (DataAvailable && pData != nullptr)
    {
        auto& QueryData = *reinterpret_cast<QueryDataBinaryOcclusion*>(pData);
        VERIFY_EXPR(DataSize == sizeof(QueryData));
        QueryData.AnySamplePassed = Results[0] != 0;
    }

    return DataAvailable;
}